

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::receiveCap
          (RpcConnectionState *this,Reader descriptor,ArrayPtr<kj::OwnFd> fds)

{
  ushort uVar1;
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 aVar2;
  long *plVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  Disposer DVar6;
  Reader ops_00;
  _func_int ***ppp_Var7;
  _func_int ***ppp_Var8;
  String *pSVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint *puVar15;
  Refcounted *refcounted;
  ClientHook *this_00;
  RpcConnectionState *pRVar16;
  ulong in_RCX;
  Refcounted *refcounted_1;
  RpcClient *extraout_RDX;
  RpcConnectionState *pRVar17;
  RpcClient *extraout_RDX_00;
  RpcClient *extraout_RDX_01;
  RpcClient *extraout_RDX_02;
  RpcClient *extraout_RDX_03;
  RpcClient *extraout_RDX_04;
  RpcConnectionState *extraout_RDX_05;
  RpcClient *extraout_RDX_06;
  RpcClient *extraout_RDX_07;
  RpcClient *extraout_RDX_08;
  RpcClient *extraout_RDX_09;
  RpcClient *extraout_RDX_10;
  RpcClient *extraout_RDX_11;
  RpcClient *extraout_RDX_12;
  RpcClient *extraout_RDX_13;
  undefined1 uVar18;
  Reader *ptrCopy_4;
  ImportId importId;
  OwnFd *pOVar19;
  long lVar20;
  ulong uVar21;
  PipelineOp *ptrCopy;
  RpcClient *result;
  Reader *ptrCopy_1;
  bool bVar22;
  Exception *pEVar23;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar24;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> OVar25;
  Own<capnp::ClientHook,_std::nullptr_t> OVar26;
  StringPtr reason;
  StringPtr reason_00;
  Maybe<kj::OwnFd> fd;
  Fault f;
  Reader promisedAnswer;
  Array<capnp::PipelineOp> ops;
  Maybe<kj::OwnFd> local_100;
  undefined1 local_f8 [24];
  undefined1 local_e0 [8];
  undefined1 local_d8 [24];
  WirePointer *local_c0;
  uint local_b8;
  StructPointerCount local_b4;
  undefined1 local_b0 [8];
  undefined1 local_a8 [32];
  Maybe<kj::OwnFd> local_88;
  undefined1 local_80 [8];
  capnp local_78 [24];
  undefined1 local_60 [48];
  
  pRVar17 = (RpcConnectionState *)fds.size_;
  pOVar19 = fds.ptr;
  uVar21 = 0xff;
  if (0x17 < descriptor._reader.dataSize) {
    uVar21 = (ulong)*(byte *)((long)descriptor._reader.data + 2) ^ 0xff;
  }
  local_100.ptr.isSet = false;
  if ((uVar21 < in_RCX) &&
     (aVar2 = *(anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 *)
               ((long)&(((RpcClient *)pRVar17)->super_ClientHook)._vptr_ClientHook + uVar21 * 4),
     -1 < (int)aVar2)) {
    *(undefined4 *)((long)&(((RpcClient *)pRVar17)->super_ClientHook)._vptr_ClientHook + uVar21 * 4)
         = 0xffffffff;
    local_100.ptr.isSet = true;
    local_100.ptr.field_1 = aVar2;
  }
  if (descriptor._reader.dataSize < 0x10) {
switchD_00339b2a_caseD_0:
    pEVar23 = (Exception *)0x0;
    pRVar16 = (RpcConnectionState *)0x0;
    goto LAB_00339ae1;
  }
  uVar1 = *descriptor._reader.data;
  if (5 < (ulong)uVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
              ((Fault *)local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x882,FAILED,(char *)0x0,"\"unknown CapDescriptor type\"",
               (char (*) [27])"unknown CapDescriptor type");
    kj::_::Debug::Fault::fatal((Fault *)local_d8);
  }
  pRVar17 = (RpcConnectionState *)
            ((long)&switchD_00339b2a::switchdataD_00559ecc +
            (long)(int)(&switchD_00339b2a::switchdataD_00559ecc)[uVar1]);
  importId = (ImportId)fds.ptr;
  switch(uVar1) {
  case 0:
    goto switchD_00339b2a_caseD_0;
  case 1:
    uVar18 = false;
    if (0x3f < descriptor._reader.dataSize) {
      uVar18 = (undefined1)*(undefined4 *)((long)descriptor._reader.data + 4);
    }
    kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)local_80,&local_100);
    OVar25 = import((RpcConnectionState *)local_d8,importId,(bool)uVar18,(Maybe<kj::OwnFd> *)0x0);
    pRVar17 = (RpcConnectionState *)OVar25.ptr;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_d8._0_8_;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_d8._8_8_;
    local_d8._8_8_ = (RpcConnectionState *)0x0;
    if ((bool)local_80[0] == true) {
      kj::OwnFd::~OwnFd((OwnFd *)(local_80 + 4));
      pRVar17 = (RpcConnectionState *)extraout_RDX_00;
    }
    break;
  case 2:
    uVar18 = false;
    if (0x3f < descriptor._reader.dataSize) {
      uVar18 = (undefined1)*(undefined4 *)((long)descriptor._reader.data + 4);
    }
    kj::Maybe<kj::OwnFd>::Maybe(&local_88,&local_100);
    OVar25 = import((RpcConnectionState *)local_d8,importId,(bool)uVar18,(Maybe<kj::OwnFd> *)0x1);
    pRVar17 = (RpcConnectionState *)OVar25.ptr;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_d8._0_8_;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_d8._8_8_;
    local_d8._8_8_ = (RpcConnectionState *)0x0;
    if (local_88.ptr.isSet == true) {
      kj::OwnFd::~OwnFd(&local_88.ptr.field_1.value);
      pRVar17 = (RpcConnectionState *)extraout_RDX_03;
    }
    break;
  case 3:
    anon_unknown_18::ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>
    ::find((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
           local_d8,importId + 0x1b8);
    uVar10 = local_d8._0_8_;
    if ((SegmentReader *)local_d8._0_8_ != (SegmentReader *)0x0) {
      (**(code **)((_func_int *)
                   ((ArrayPtr<const_capnp::word> *)(local_d8._0_8_ + 0x10))->ptr->content + 0x20))
                (local_d8);
      uVar14 = local_d8._8_8_;
      pp_Var4 = *(_func_int ***)&((SegmentId *)(uVar10 + 0x30))->value;
      pRVar17 = (RpcConnectionState *)extraout_RDX_04;
      if ((pp_Var4 != (_func_int **)0x0) && (*(int *)pp_Var4 == 2)) {
        bVar22 = (((Refcounted *)(local_d8._8_8_ + 8))->super_Disposer)._vptr_Disposer ==
                 *(_func_int ***)(pOVar19 + 0x2c0);
        local_a8[0] = bVar22;
        if (!bVar22) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)local_f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x855,FAILED,"isSameNetwork(*result)","_kjCondition,",
                     (DebugExpression<bool> *)local_a8);
          kj::_::Debug::Fault::fatal((Fault *)local_f8);
        }
        local_78[0x10] = (capnp)local_d8[0];
        local_78[0x11] = (capnp)local_d8[1];
        local_78[0x12] = (capnp)local_d8[2];
        local_78[0x13] = (capnp)local_d8[3];
        local_78[0x14] = (capnp)local_d8[4];
        local_78[0x15] = (capnp)local_d8[5];
        local_78[0x16] = (capnp)local_d8[6];
        local_78[0x17] = (capnp)local_d8[7];
        local_d8._8_8_ = (_func_int **)0x0;
        pvVar5 = *(void **)(uVar14 + 0x28);
        clone<capnp::AnyPointer::Reader&,capnp::AnyPointer>((capnp *)local_f8,(Reader *)pp_Var4[2]);
        pRVar16 = (RpcConnectionState *)operator_new(0x70);
        uVar13 = local_f8._8_8_;
        uVar10 = local_f8._0_8_;
        local_f8._8_8_ = (RpcConnectionState *)0x0;
        ClientHook::ClientHook((ClientHook *)pRVar16,*(void **)((long)pvVar5 + 0xb00));
        uVar11 = local_d8._0_8_;
        puVar15 = &(pRVar16->super_Refcounted).refcount;
        *(int *)((long)pvVar5 + 0x10) = *(int *)((long)pvVar5 + 0x10) + 1;
        *(long *)&(pRVar16->connection).tag = (long)pvVar5 + 8;
        *(void **)&(pRVar16->connection).field_1 = pvVar5;
        *(undefined1 (*) [16])((long)&(pRVar16->connection).field_1 + 8) = (undefined1  [16])0x0;
        (pRVar16->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&PTR_newCall_006cf208;
        *(undefined ***)&(pRVar16->super_Refcounted).refcount = &PTR_disposeImpl_006cf280;
        *(undefined4 *)((long)&(pRVar16->connection).field_1 + 0x18) = 1;
        *(undefined8 *)((long)&(pRVar16->connection).field_1 + 0x20) = uVar10;
        *(undefined8 *)((long)&(pRVar16->connection).field_1 + 0x28) = uVar13;
        *(undefined8 *)((long)&(pRVar16->connection).field_1 + 0x30) = local_78._16_8_;
        *(undefined8 *)((long)&(pRVar16->connection).field_1 + 0x38) = uVar14;
        (pRVar16->connection).field_1.space[0x40] = '\0';
        *(undefined4 *)&pRVar16->bootstrapFactory = 1;
        pRVar17 = (RpcConnectionState *)uVar14;
        if ((_func_int **)local_d8._8_8_ != (_func_int **)0x0) {
          lVar20 = local_d8._8_8_ + *(long *)(*(_func_int **)local_d8._8_8_ + -0x10);
          DVar6._vptr_Disposer = *(_func_int ***)local_d8._0_8_;
          local_d8._0_8_ = puVar15;
          local_d8._8_8_ = pRVar16;
          (**DVar6._vptr_Disposer)(uVar11,lVar20);
          pRVar17 = extraout_RDX_05;
          puVar15 = (uint *)local_d8._0_8_;
          pRVar16 = (RpcConnectionState *)local_d8._8_8_;
        }
        local_d8._8_8_ = pRVar16;
        local_d8._0_8_ = puVar15;
        if ((RpcConnectionState *)local_f8._8_8_ != (RpcConnectionState *)0x0) {
          local_f8._8_8_ = (RpcConnectionState *)0x0;
          (*(code *)((Arena *)(((String *)local_f8._0_8_)->content).ptr)->_vptr_Arena)();
          pRVar17 = (RpcConnectionState *)extraout_RDX_06;
        }
      }
      uVar10 = local_d8._8_8_;
      puVar15 = (uint *)local_d8._0_8_;
      pRVar16 = (RpcConnectionState *)local_d8._8_8_;
      if (((((Refcounted *)(local_d8._8_8_ + 8))->super_Disposer)._vptr_Disposer ==
           *(_func_int ***)(pOVar19 + 0x2c0)) && (*(OwnFd **)(local_d8._8_8_ + 0x28) == pOVar19)) {
        pRVar16 = (RpcConnectionState *)operator_new(0x30);
        uVar14 = local_d8._0_8_;
        local_d8._8_8_ = (_func_int **)0x0;
        ClientHook::ClientHook((ClientHook *)pRVar16,(void *)0x0);
        uVar13 = local_d8._0_8_;
        puVar15 = &(pRVar16->super_Refcounted).refcount;
        (pRVar16->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&PTR_newCall_006cf5d0;
        *(undefined **)&(pRVar16->super_Refcounted).refcount = &DAT_006cf620;
        *(undefined8 *)&(pRVar16->connection).tag = uVar14;
        *(undefined8 *)&(pRVar16->connection).field_1 = uVar10;
        *(undefined4 *)&pRVar16->bootstrapFactory = 1;
        pRVar17 = (RpcConnectionState *)extraout_RDX_10;
        if ((_func_int **)local_d8._8_8_ != (_func_int **)0x0) {
          lVar20 = local_d8._8_8_ + *(long *)(*(_func_int **)local_d8._8_8_ + -0x10);
          DVar6._vptr_Disposer = *(_func_int ***)local_d8._0_8_;
          local_d8._0_8_ = puVar15;
          local_d8._8_8_ = pRVar16;
          (**DVar6._vptr_Disposer)(uVar13,lVar20);
          pRVar17 = (RpcConnectionState *)extraout_RDX_11;
          puVar15 = (uint *)local_d8._0_8_;
          pRVar16 = (RpcConnectionState *)local_d8._8_8_;
        }
      }
      local_d8._8_8_ = pRVar16;
      local_d8._0_8_ = puVar15;
      (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_d8._0_8_;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_d8._8_8_;
      break;
    }
    reason_00.content.size_ = (size_t)"invalid \'receiverHosted\' export ID";
    reason_00.content.ptr = local_d8;
    OVar26 = newBrokenCap(reason_00);
    pRVar17 = (RpcConnectionState *)OVar26.ptr;
    pEVar23 = (Exception *)local_d8._0_8_;
    pRVar16 = (RpcConnectionState *)local_d8._8_8_;
    goto LAB_00339ae1;
  case 4:
    bVar22 = descriptor._reader.pointerCount == 0;
    local_f8._16_8_ = descriptor._reader.pointers;
    if (bVar22) {
      local_f8._16_8_ = (WirePointer *)0x0;
    }
    local_e0._0_4_ = 0x7fffffff;
    if (!bVar22) {
      local_e0._0_4_ = descriptor._reader.nestingLimit;
    }
    local_f8._0_8_ = (Exception *)0x0;
    local_f8._8_8_ = (RpcConnectionState *)0x0;
    if (!bVar22) {
      local_f8._0_8_ = descriptor._reader.segment;
      local_f8._8_8_ = descriptor._reader.capTable;
    }
    PointerReader::getStruct((StructReader *)local_d8,(PointerReader *)local_f8,(word *)0x0);
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
    ::find((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)
           local_f8,importId + 0x2d8);
    uVar10 = local_f8._0_8_;
    if (((Exception *)local_f8._0_8_ != (Exception *)0x0) &&
       (*(long *)&(((String *)local_f8._0_8_)->content).size_ != 0)) {
      bVar22 = local_b4 == 0;
      local_f8._16_8_ = local_c0;
      if (bVar22) {
        local_f8._16_8_ = (WirePointer *)0x0;
      }
      local_e0._0_4_ = 0x7fffffff;
      if (!bVar22) {
        local_e0._0_4_ = local_b0._0_4_;
      }
      local_f8._0_8_ = (Exception *)0x0;
      local_f8._8_8_ = (RpcConnectionState *)0x0;
      if (!bVar22) {
        local_f8._0_8_ = local_d8._0_8_;
        local_f8._8_8_ = local_d8._8_8_;
      }
      PointerReader::getList
                ((ListReader *)local_60,(PointerReader *)local_f8,INLINE_COMPOSITE,(word *)0x0);
      ops_00.reader.capTable = (CapTableReader *)local_60._8_8_;
      ops_00.reader.segment = (SegmentReader *)local_60._0_8_;
      ops_00.reader.ptr = (byte *)local_60._16_8_;
      ops_00.reader.elementCount = local_60._24_4_;
      ops_00.reader.step = local_60._28_4_;
      ops_00.reader.structDataSize = local_60._32_4_;
      ops_00.reader.structPointerCount = local_60._36_2_;
      ops_00.reader.elementSize = local_60[0x26];
      ops_00.reader._39_1_ = local_60[0x27];
      ops_00.reader._40_8_ = local_60._40_8_;
      anon_unknown_18::toPipelineOps(ops_00);
      plVar3 = *(long **)&(((String *)uVar10)->content).size_;
      uVar14 = local_a8._0_8_;
      uVar13 = local_a8._8_8_;
      (**(code **)(*plVar3 + 8))(local_f8,plVar3,local_a8._0_8_,local_a8._8_8_);
      uVar10 = local_f8._8_8_;
      pRVar17 = (RpcConnectionState *)extraout_RDX_01;
      puVar15 = (uint *)local_f8._0_8_;
      pRVar16 = (RpcConnectionState *)local_f8._8_8_;
      if (((((Refcounted *)(local_f8._8_8_ + 8))->super_Disposer)._vptr_Disposer ==
           *(_func_int ***)(pOVar19 + 0x2c0)) &&
         (*(OwnFd **)
           &((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception> *)
            (local_f8._8_8_ + 0x20))->field_1 == pOVar19)) {
        pRVar16 = (RpcConnectionState *)operator_new(0x30);
        uVar11 = local_f8._0_8_;
        local_f8._8_8_ = (CapTableReader *)0x0;
        ClientHook::ClientHook((ClientHook *)pRVar16,(void *)0x0);
        uVar12 = local_f8._0_8_;
        puVar15 = &(pRVar16->super_Refcounted).refcount;
        ((ClientHook *)&pRVar16->super_ErrorHandler)->_vptr_ClientHook =
             (_func_int **)&PTR_newCall_006cf5d0;
        *(undefined **)&(pRVar16->super_Refcounted).refcount = &DAT_006cf620;
        *(undefined8 *)&(pRVar16->connection).tag = uVar11;
        *(undefined8 *)&(pRVar16->connection).field_1 = uVar10;
        *(uint *)&pRVar16->bootstrapFactory = 1;
        pRVar17 = (RpcConnectionState *)extraout_RDX_12;
        if ((CapTableReader *)local_f8._8_8_ != (CapTableReader *)0x0) {
          ppp_Var7 = (_func_int ***)local_f8._8_8_;
          ppp_Var8 = (_func_int ***)local_f8._8_8_;
          pSVar9 = (String *)local_f8._0_8_;
          local_f8._0_8_ = puVar15;
          local_f8._8_8_ = pRVar16;
          (*(code *)((Arena *)(pSVar9->content).ptr)->_vptr_Arena)
                    (uVar12,(_func_int *)((long)ppp_Var8 + (long)(*ppp_Var7)[-2]));
          pRVar17 = (RpcConnectionState *)extraout_RDX_13;
          puVar15 = (uint *)local_f8._0_8_;
          pRVar16 = (RpcConnectionState *)local_f8._8_8_;
        }
      }
      local_f8._8_8_ = pRVar16;
      local_f8._0_8_ = puVar15;
      (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_f8._0_8_;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_f8._8_8_;
      if (uVar14 != 0) {
        local_a8._0_16_ = (undefined1  [16])0x0;
        (*(code *)**(undefined8 **)local_a8._16_8_)(local_a8._16_8_,uVar14,8,uVar13,uVar13,0);
        pRVar17 = (RpcConnectionState *)extraout_RDX_02;
      }
      break;
    }
    reason.content.size_ = (size_t)"invalid \'receiverAnswer\'";
    reason.content.ptr = local_f8;
    OVar26 = newBrokenCap(reason);
    pRVar17 = (RpcConnectionState *)OVar26.ptr;
    pEVar23 = (Exception *)local_f8._0_8_;
    pRVar16 = (RpcConnectionState *)local_f8._8_8_;
LAB_00339ae1:
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)pEVar23;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pRVar16;
    break;
  case 5:
    bVar22 = descriptor._reader.pointerCount == 0;
    local_f8._16_8_ = descriptor._reader.pointers;
    if (bVar22) {
      local_f8._16_8_ = (WirePointer *)0x0;
    }
    local_e0._0_4_ = 0x7fffffff;
    if (!bVar22) {
      local_e0._0_4_ = descriptor._reader.nestingLimit;
    }
    local_f8._0_8_ = (Exception *)0x0;
    local_f8._8_8_ = (CapTableReader *)0x0;
    if (!bVar22) {
      local_f8._0_8_ = descriptor._reader.segment;
      local_f8._8_8_ = descriptor._reader.capTable;
    }
    PointerReader::getStruct((StructReader *)local_d8,(PointerReader *)local_f8,(word *)0x0);
    uVar18 = false;
    if (0x1f < local_b8) {
      uVar18 = (undefined1)*(uint *)local_d8._16_8_;
    }
    kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)(local_a8 + 0x18),&local_100);
    import((RpcConnectionState *)local_a8,importId,(bool)uVar18,(Maybe<kj::OwnFd> *)0x0);
    if (local_a8[0x18] == '\x01') {
      kj::OwnFd::~OwnFd((OwnFd *)(local_a8 + 0x1c));
    }
    bVar22 = local_b4 != 0;
    local_f8._16_8_ = (WirePointer *)0x0;
    if (bVar22) {
      local_f8._16_8_ = local_c0;
    }
    local_e0._0_4_ = 0x7fffffff;
    if (bVar22) {
      local_e0._0_4_ = local_b0._0_4_;
    }
    local_f8._0_8_ = (Exception *)0x0;
    local_f8._8_8_ = (RpcConnectionState *)0x0;
    if (bVar22) {
      local_f8._0_8_ = local_d8._0_8_;
      local_f8._8_8_ = local_d8._8_8_;
    }
    clone<capnp::AnyPointer::Reader,capnp::AnyPointer>(local_78,(Reader *)local_f8);
    this_00 = (ClientHook *)operator_new(0x70);
    uVar11 = local_78._8_8_;
    uVar13 = local_78._0_8_;
    local_78._8_8_ = (_func_int **)0x0;
    uVar10 = local_a8._0_8_;
    uVar14 = local_a8._8_8_;
    local_a8._8_8_ = 0;
    ClientHook::ClientHook(this_00,*(void **)(pOVar19 + 0x2c0));
    pOVar19[4].fd = pOVar19[4].fd + 1;
    this_00[2]._vptr_ClientHook = (_func_int **)(pOVar19 + 2);
    this_00[2].brand = pOVar19;
    this_00[3]._vptr_ClientHook = (_func_int **)0x0;
    this_00[3].brand = (void *)0x0;
    this_00->_vptr_ClientHook = (_func_int **)&PTR_newCall_006cf208;
    this_00[1]._vptr_ClientHook = (_func_int **)&PTR_disposeImpl_006cf280;
    *(undefined4 *)&this_00[4]._vptr_ClientHook = 1;
    this_00[5].brand = (void *)uVar10;
    this_00[6]._vptr_ClientHook = (_func_int **)uVar14;
    this_00[4].brand = (void *)uVar13;
    this_00[5]._vptr_ClientHook = (_func_int **)uVar11;
    *(undefined1 *)&this_00[6].brand = 0;
    *(undefined4 *)&this_00[1].brand = 1;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)(this_00 + 1);
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)this_00;
    pRVar17 = (RpcConnectionState *)extraout_RDX_07;
    if ((_func_int **)local_78._8_8_ != (_func_int **)0x0) {
      local_78._8_8_ = (_func_int **)0x0;
      (*(code *)**(undefined8 **)local_78._0_8_)();
      pRVar17 = (RpcConnectionState *)extraout_RDX_08;
    }
    uVar10 = local_a8._8_8_;
    if ((long *)local_a8._8_8_ != (long *)0x0) {
      local_a8._8_8_ = 0;
      (*(code *)**(undefined8 **)local_a8._0_8_)
                (local_a8._0_8_,uVar10 + *(long *)(*(long *)uVar10 + -0x10));
      pRVar17 = (RpcConnectionState *)extraout_RDX_09;
    }
  }
  if (local_100.ptr.isSet == true) {
    kj::OwnFd::~OwnFd(&local_100.ptr.field_1.value);
    pRVar17 = (RpcConnectionState *)extraout_RDX;
  }
  MVar24.ptr.ptr = (ClientHook *)pRVar17;
  MVar24.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar24.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> receiveCap(rpc::CapDescriptor::Reader descriptor,
                                            kj::ArrayPtr<kj::OwnFd> fds) {
    uint fdIndex = descriptor.getAttachedFd();
    kj::Maybe<kj::OwnFd> fd;
    if (fdIndex < fds.size() && fds[fdIndex] != nullptr) {
      fd = kj::mv(fds[fdIndex]);
    }

    switch (descriptor.which()) {
      case rpc::CapDescriptor::NONE:
        return kj::none;

      case rpc::CapDescriptor::SENDER_HOSTED:
        return import(descriptor.getSenderHosted(), false, kj::mv(fd));
      case rpc::CapDescriptor::SENDER_PROMISE:
        return import(descriptor.getSenderPromise(), true, kj::mv(fd));

      case rpc::CapDescriptor::RECEIVER_HOSTED:
        KJ_IF_SOME(exp, exports.find(descriptor.getReceiverHosted())) {
          auto result = exp.clientHook->addRef();
          KJ_IF_SOME(vineInfo, exp.vineInfo) {
            KJ_IF_SOME(contact, vineInfo->info.tryGet<VineInfo::Contact>()) {
              // This is a vine, and not the root of the vine. We previously forwarded a
              // three-party handoff to the peer, and the peer reflected it back to us. We need
              // to wrap this in a new `DeferredThirdPartyClient` so that if it is sent to yet
              // another party, it will be handed off correctly. If we just pass along the vine
              // itself, then three-party handoff will stop working.
              KJ_ASSERT(isSameNetwork(*result));
              kj::Own<RpcClient> vine = result.downcast<RpcClient>();
              auto& vineConnection = *vine->connectionState;
              result = kj::refcounted<DeferredThirdPartyClient>(
                  vineConnection, capnp::clone(*contact), kj::mv(vine));
            }
          }
          if (unwrapIfSameConnection(*result) != kj::none) {
            result = kj::refcounted<TribbleRaceBlocker>(kj::mv(result));
          }
          return kj::mv(result);
        } else {
          return newBrokenCap("invalid 'receiverHosted' export ID");
        }

      case rpc::CapDescriptor::RECEIVER_ANSWER: {
        auto promisedAnswer = descriptor.getReceiverAnswer();

        KJ_IF_SOME(answer, answers.find(promisedAnswer.getQuestionId())) {
          KJ_IF_SOME(pipeline, answer.pipeline) {
            auto ops = toPipelineOps(promisedAnswer.getTransform());
            auto result = pipeline->getPipelinedCap(ops);
            if (unwrapIfSameConnection(*result) != kj::none) {
              result = kj::refcounted<TribbleRaceBlocker>(kj::mv(result));
            }
            return kj::mv(result);
          }
        }

        return newBrokenCap("invalid 'receiverAnswer'");
      }

      case rpc::CapDescriptor::THIRD_PARTY_HOSTED: {
        // We need to connect to a third party to accept this capability.

        auto tph = descriptor.getThirdPartyHosted();

        // Import the vine first so that we're sure to drop it if anything goes wrong.
        auto vine = import(tph.getVineId(), false, kj::mv(fd));

        return kj::refcounted<DeferredThirdPartyClient>(
            *this, capnp::clone(tph.getId()), kj::mv(vine));
      }

      default:
        KJ_FAIL_REQUIRE("unknown CapDescriptor type");
        return newBrokenCap("unknown CapDescriptor type");
    }